

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O0

Pointer __thiscall
dg::pta::LLVMPointerGraphBuilder::handleConstantArithmetic
          (LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  bool bVar1;
  PSNode *n;
  LLVMPointerGraphBuilder *in_RDI;
  Pointer PVar2;
  Pointer ptr;
  PSNode *op;
  const_iterator *in_stack_ffffffffffffff78;
  uint uVar3;
  Value *in_stack_ffffffffffffff80;
  Offset in_stack_ffffffffffffff90;
  LLVMPointerGraphBuilder *in_stack_ffffffffffffff98;
  PSNode *local_50;
  Offset local_40;
  Value *local_38;
  Value *local_30;
  PSNode *local_28;
  Pointer local_10;
  
  local_30 = llvm::User::getOperand
                       ((User *)in_stack_ffffffffffffff80,
                        (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  bVar1 = llvm::isa<llvm::ConstantInt,llvm::Value*>((Value **)0x1b6096);
  uVar3 = (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  if (bVar1) {
    llvm::User::getOperand((User *)in_stack_ffffffffffffff80,uVar3);
    local_28 = getOperand(in_RDI,in_stack_ffffffffffffff80);
  }
  else {
    local_38 = llvm::User::getOperand((User *)in_stack_ffffffffffffff80,uVar3);
    bVar1 = llvm::isa<llvm::ConstantInt,llvm::Value*>((Value **)0x1b60e0);
    uVar3 = (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    if (bVar1) {
      llvm::User::getOperand((User *)in_stack_ffffffffffffff80,uVar3);
      local_28 = getOperand(in_RDI,in_stack_ffffffffffffff80);
    }
    else {
      llvm::User::getOperand((User *)in_stack_ffffffffffffff80,uVar3);
      local_28 = tryGetOperand(in_stack_ffffffffffffff98,(Value *)in_stack_ffffffffffffff90.offset);
      if (local_28 == (PSNode *)0x0) {
        llvm::User::getOperand
                  ((User *)in_stack_ffffffffffffff80,
                   (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        local_28 = tryGetOperand(in_stack_ffffffffffffff98,(Value *)in_stack_ffffffffffffff90.offset
                                );
      }
      if (local_28 == (PSNode *)0x0) {
        createUnknown((LLVMPointerGraphBuilder *)in_stack_ffffffffffffff90.offset,(Value *)in_RDI);
        n = PSNodesSeq::getSingleNode((PSNodesSeq *)0x1b616f);
        Offset::Offset(&local_40,Offset::UNKNOWN);
        Pointer::Pointer(&local_10,n,local_40);
        return local_10;
      }
    }
  }
  PointerIdPointsToSet::begin((PointerIdPointsToSet *)in_stack_ffffffffffffff80);
  PVar2 = PointerIdPointsToSet::const_iterator::operator*(in_stack_ffffffffffffff78);
  local_50 = PVar2.target;
  Offset::Offset((Offset *)&stack0xffffffffffffff90,Offset::UNKNOWN);
  Pointer::Pointer(&local_10,local_50,in_stack_ffffffffffffff90);
  return local_10;
}

Assistant:

Pointer LLVMPointerGraphBuilder::handleConstantArithmetic(
        const llvm::Instruction *Inst) {
    using namespace llvm;

    PSNode *op;

    if (isa<ConstantInt>(Inst->getOperand(0))) {
        op = getOperand(Inst->getOperand(1));
    } else if (isa<ConstantInt>(Inst->getOperand(1))) {
        op = getOperand(Inst->getOperand(0));
    } else {
        op = tryGetOperand(Inst->getOperand(0));
        if (!op)
            op = tryGetOperand(Inst->getOperand(1));

        if (!op)
            return Pointer{createUnknown(Inst).getSingleNode(),
                           Offset::UNKNOWN};
    }

    assert(op && "Don't have operand for add");
    assert(op->pointsTo.size() == 1 &&
           "Constant add with not only one pointer");

    Pointer ptr = *op->pointsTo.begin();
    return {ptr.target, Offset::UNKNOWN};
}